

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_js_generator.cc
# Opt level: O2

void __thiscall
t_js_generator::generate_js_struct_reader(t_js_generator *this,ostream *out,t_struct *tstruct)

{
  int *piVar1;
  string *psVar2;
  bool bVar3;
  t_field *tfield;
  int iVar4;
  ostream *poVar5;
  undefined4 extraout_var;
  pointer pptVar6;
  char *pcVar7;
  pointer pptVar8;
  string local_98;
  pointer local_78;
  string local_70;
  string local_50;
  
  bVar3 = this->gen_es6_;
  poVar5 = t_generator::indent((t_generator *)this,out);
  if (bVar3 == true) {
    poVar5 = std::operator<<(poVar5,"read (input) {");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  }
  else {
    js_namespace_abi_cxx11_(&local_98,this,(tstruct->super_t_type).program_);
    poVar5 = std::operator<<(poVar5,(string *)&local_98);
    iVar4 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
    poVar5 = std::operator<<(poVar5,(string *)CONCAT44(extraout_var,iVar4));
    poVar5 = std::operator<<(poVar5,".prototype.read = function(input) {");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_98);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar5 = t_generator::indent((t_generator *)this,out);
  poVar5 = std::operator<<(poVar5,"input.readStructBegin();");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = t_generator::indent((t_generator *)this,out);
  poVar5 = std::operator<<(poVar5,"while (true) {");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar5 = t_generator::indent((t_generator *)this,out);
  psVar2 = &this->js_const_type_;
  poVar5 = std::operator<<(poVar5,(string *)psVar2);
  poVar5 = std::operator<<(poVar5,"ret = input.readFieldBegin();");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = t_generator::indent((t_generator *)this,out);
  poVar5 = std::operator<<(poVar5,(string *)psVar2);
  poVar5 = std::operator<<(poVar5,"ftype = ret.ftype;");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  if ((tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    poVar5 = t_generator::indent((t_generator *)this,out);
    poVar5 = std::operator<<(poVar5,(string *)psVar2);
    poVar5 = std::operator<<(poVar5,"fid = ret.fid;");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  }
  poVar5 = t_generator::indent((t_generator *)this,out);
  poVar5 = std::operator<<(poVar5,"if (ftype == Thrift.Type.STOP) {");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar5 = t_generator::indent((t_generator *)this,out);
  poVar5 = std::operator<<(poVar5,"break;");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar5 = t_generator::indent((t_generator *)this,out);
  poVar5 = std::operator<<(poVar5,"}");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  pptVar6 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pptVar8 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  poVar5 = t_generator::indent((t_generator *)this,out);
  if (pptVar6 == pptVar8) {
    poVar5 = std::operator<<(poVar5,"input.skip(ftype);");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  }
  else {
    poVar5 = std::operator<<(poVar5,"switch (fid) {");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    pptVar8 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    pptVar6 = pptVar8 + -1;
    for (; pptVar8 !=
           (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
           super__Vector_impl_data._M_finish; pptVar8 = pptVar8 + 1) {
      local_78 = pptVar6;
      poVar5 = t_generator::indent((t_generator *)this,out);
      poVar5 = std::operator<<(poVar5,"case ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,(*pptVar8)->key_);
      poVar5 = std::operator<<(poVar5,":");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      poVar5 = t_generator::indent((t_generator *)this,out);
      pcVar7 = "if (ftype == ";
      poVar5 = std::operator<<(poVar5,"if (ftype == ");
      type_to_enum_abi_cxx11_(&local_98,(t_js_generator *)pcVar7,(*pptVar8)->type_);
      poVar5 = std::operator<<(poVar5,(string *)&local_98);
      poVar5 = std::operator<<(poVar5,") {");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_98);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      tfield = *pptVar8;
      std::__cxx11::string::string((string *)&local_50,"this.",(allocator *)&local_98);
      generate_deserialize_field(this,out,tfield,&local_50,false);
      std::__cxx11::string::~string((string *)&local_50);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      poVar5 = t_generator::indent((t_generator *)this,out);
      poVar5 = std::operator<<(poVar5,"} else {");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      poVar5 = t_generator::indent((t_generator *)this,out);
      poVar5 = std::operator<<(poVar5,"  input.skip(ftype);");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_98,(t_generator *)this);
      poVar5 = std::operator<<(out,(string *)&local_98);
      poVar5 = std::operator<<(poVar5,"}");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_70,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_70);
      poVar5 = std::operator<<(poVar5,"break;");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_98);
      pptVar6 = local_78 + 1;
    }
    if ((tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_start == pptVar6) {
      poVar5 = t_generator::indent((t_generator *)this,out);
      poVar5 = std::operator<<(poVar5,"case 0:");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      poVar5 = t_generator::indent((t_generator *)this,out);
      poVar5 = std::operator<<(poVar5,"  input.skip(ftype);");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      poVar5 = t_generator::indent((t_generator *)this,out);
      poVar5 = std::operator<<(poVar5,"  break;");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    }
    poVar5 = t_generator::indent((t_generator *)this,out);
    poVar5 = std::operator<<(poVar5,"default:");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    poVar5 = t_generator::indent((t_generator *)this,out);
    poVar5 = std::operator<<(poVar5,"  input.skip(ftype);");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  }
  poVar5 = t_generator::indent((t_generator *)this,out);
  poVar5 = std::operator<<(poVar5,"input.readFieldEnd();");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  poVar5 = t_generator::indent((t_generator *)this,out);
  poVar5 = std::operator<<(poVar5,"input.readStructEnd();");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = t_generator::indent((t_generator *)this,out);
  poVar5 = std::operator<<(poVar5,"return;");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  pcVar7 = "};";
  if (this->gen_es6_ != false) {
    pcVar7 = "}";
  }
  poVar5 = t_generator::indent((t_generator *)this,out);
  poVar5 = std::operator<<(poVar5,pcVar7);
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_js_generator::generate_js_struct_reader(ostream& out, t_struct* tstruct) {
  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;

  if (gen_es6_) {
    indent(out) << "read (input) {" << endl;
  } else {
    indent(out) << js_namespace(tstruct->get_program()) << tstruct->get_name()
        << ".prototype.read = function(input) {" << endl;
  }

  indent_up();

  indent(out) << "input.readStructBegin();" << endl;

  // Loop over reading in fields
  indent(out) << "while (true) {" << endl;

  indent_up();

  indent(out) << js_const_type_ << "ret = input.readFieldBegin();" << endl;
  indent(out) << js_const_type_ << "ftype = ret.ftype;" << endl;
  if (!fields.empty()) {
    indent(out) << js_const_type_ << "fid = ret.fid;" << endl;
  }

  // Check for field STOP marker and break
  indent(out) << "if (ftype == Thrift.Type.STOP) {" << endl;
  indent_up();
  indent(out) << "break;" << endl;
  indent_down();
  indent(out) << "}" << endl;
  if (!fields.empty()) {
    // Switch statement on the field we are reading
    indent(out) << "switch (fid) {" << endl;

    indent_up();

    // Generate deserialization code for known cases
    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {

      indent(out) << "case " << (*f_iter)->get_key() << ":" << endl;
      indent(out) << "if (ftype == " << type_to_enum((*f_iter)->get_type()) << ") {" << endl;

      indent_up();
      generate_deserialize_field(out, *f_iter, "this.");
      indent_down();

      indent(out) << "} else {" << endl;

      indent(out) << "  input.skip(ftype);" << endl;

      out << indent() << "}" << endl << indent() << "break;" << endl;
    }
    if (fields.size() == 1) {
      // pseudo case to make jslint happy
      indent(out) << "case 0:" << endl;
      indent(out) << "  input.skip(ftype);" << endl;
      indent(out) << "  break;" << endl;
    }
    // In the default case we skip the field
    indent(out) << "default:" << endl;
    indent(out) << "  input.skip(ftype);" << endl;

    scope_down(out);
  } else {
    indent(out) << "input.skip(ftype);" << endl;
  }

  indent(out) << "input.readFieldEnd();" << endl;

  scope_down(out);

  indent(out) << "input.readStructEnd();" << endl;

  indent(out) << "return;" << endl;

  indent_down();

  if (gen_es6_) {
    indent(out) << "}" << endl << endl;
  } else {
    indent(out) << "};" << endl << endl;
  }
}